

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_extensions
          (InstanceBuilder *this,vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  iterator __position;
  pointer ppcVar3;
  char *extension;
  char *local_30;
  
  ppcVar3 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (extensions->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar3 != ppcVar2) {
    do {
      local_30 = *ppcVar3;
      __position._M_current =
           (this->info).extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->info).extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&(this->info).extensions,
                   __position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppcVar1 = &(this->info).extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 != ppcVar2);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_extensions(std::vector<const char*> const& extensions) {
    for (const auto extension : extensions) {
        info.extensions.push_back(extension);
    }
    return *this;
}